

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool matchit::impl::
     matchPatternRangeImpl<0ul,0ul,1ul,2ul,__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<>>
               (tuple<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                *rangeBegin,
               tuple<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *patternTuple,undefined4 depth,Context<> *context)

{
  bool bVar1;
  reference psVar2;
  __tuple_element_t<0UL,_tuple<Id<shared_ptr<const_Expr>_>,_Id<shared_ptr<const_Expr>_>,_Id<shared_ptr<const_Expr>_>_>_>
  *pattern;
  __tuple_element_t<1UL,_tuple<Id<shared_ptr<const_Expr>_>,_Id<shared_ptr<const_Expr>_>,_Id<shared_ptr<const_Expr>_>_>_>
  *pattern_00;
  __tuple_element_t<2UL,_tuple<Id<shared_ptr<const_Expr>_>,_Id<shared_ptr<const_Expr>_>,_Id<shared_ptr<const_Expr>_>_>_>
  *pattern_01;
  bool local_81;
  bool local_71;
  __normal_iterator<const_std::shared_ptr<const_mathiu::impl::Expr>_*,_std::vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_68;
  shared_ptr<const_mathiu::impl::Expr> *local_60;
  __normal_iterator<const_std::shared_ptr<const_mathiu::impl::Expr>_*,_std::vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_58;
  shared_ptr<const_mathiu::impl::Expr> *local_50;
  __normal_iterator<const_std::shared_ptr<const_mathiu::impl::Expr>_*,_std::vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_48;
  long local_40;
  anon_class_16_2_afc162f5 func;
  Context<> *context_local;
  tuple<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *ptStack_20;
  int32_t depth_local;
  tuple<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *patternTuple_local;
  __normal_iterator<const_std::shared_ptr<const_mathiu::impl::Expr>_*,_std::vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  *rangeBegin_local;
  
  local_40 = (long)&context_local + 4;
  local_50 = *(shared_ptr<const_mathiu::impl::Expr> **)
              &(rangeBegin->
               super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               ).
               super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               .
               super__Tuple_impl<2UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               .
               super__Head_base<2UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
               ._M_head_impl.mBlock.
               super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ;
  func.depth = (int32_t *)context;
  func.context = context;
  context_local._4_4_ = depth;
  ptStack_20 = patternTuple;
  patternTuple_local = rangeBegin;
  local_48 = std::
             next<__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>>
                       ((__normal_iterator<const_std::shared_ptr<const_mathiu::impl::Expr>_*,_std::vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                         )local_50,0);
  psVar2 = __gnu_cxx::
           __normal_iterator<const_std::shared_ptr<const_mathiu::impl::Expr>_*,_std::vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
           ::operator*(&local_48);
  pattern = std::
            get<0ul,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>
                      (ptStack_20);
  bVar1 = matchPatternRangeImpl<0ul,0ul,1ul,2ul,__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<>>(__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,int,matchit::impl::Context<>&,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)
          ::{lambda(auto:1&&,auto:2&&)#1}::operator()(&local_40,psVar2,pattern);
  local_71 = false;
  if (bVar1) {
    local_60 = *(shared_ptr<const_mathiu::impl::Expr> **)
                &(patternTuple_local->
                 super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 ).
                 super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 .
                 super__Tuple_impl<2UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 .
                 super__Head_base<2UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                 ._M_head_impl.mBlock.
                 super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
    ;
    local_58 = std::
               next<__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>>
                         ((__normal_iterator<const_std::shared_ptr<const_mathiu::impl::Expr>_*,_std::vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                           )local_60,1);
    psVar2 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<const_mathiu::impl::Expr>_*,_std::vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
             ::operator*(&local_58);
    pattern_00 = std::
                 get<1ul,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>
                           (ptStack_20);
    bVar1 = matchPatternRangeImpl<0ul,0ul,1ul,2ul,__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<>>(__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,int,matchit::impl::Context<>&,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)
            ::{lambda(auto:1&&,auto:2&&)#1}::operator()(&local_40,psVar2,pattern_00);
    local_81 = false;
    if (bVar1) {
      local_68 = std::
                 next<__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>>
                           (*(shared_ptr<const_mathiu::impl::Expr> **)
                             &(patternTuple_local->
                              super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                              ).
                              super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                              .
                              super__Tuple_impl<2UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                              .
                              super__Head_base<2UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                              ._M_head_impl.mBlock.
                              super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                            ,2);
      psVar2 = __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<const_mathiu::impl::Expr>_*,_std::vector<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
               ::operator*(&local_68);
      pattern_01 = std::
                   get<2ul,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>
                             (ptStack_20);
      local_81 = matchPatternRangeImpl<0ul,0ul,1ul,2ul,__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<>>(__gnu_cxx::__normal_iterator<std::shared_ptr<mathiu::impl::Expr_const>const*,std::vector<std::shared_ptr<mathiu::impl::Expr_const>,std::allocator<std::shared_ptr<mathiu::impl::Expr_const>>>>&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,int,matchit::impl::Context<>&,std::integer_sequence<unsigned_long,0ul,1ul,2ul>)
                 ::{lambda(auto:1&&,auto:2&&)#1}::operator()(&local_40,psVar2,pattern_01);
    }
    local_71 = local_81;
  }
  return local_71;
}

Assistant:

constexpr decltype(auto) matchPatternRangeImpl(RangeBegin &&rangeBegin,
                                                       PatternTuple &&patternTuple,
                                                       int32_t depth, ContextT &context,
                                                       std::index_sequence<I...>)
        {
            auto const func = [&](auto &&value, auto &&pattern)
            {
                return matchPattern(std::forward<decltype(value)>(value), pattern,
                                    depth + 1, context);
            };
            static_cast<void>(func);
            // Fix Me, avoid call next from begin every time.
            return (func(*std::next(rangeBegin, static_cast<long>(I)),
                         std::get<I + patternStartIdx>(patternTuple)) &&
                    ...);
        }